

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O3

void __thiscall five_point_solver::advance_b(five_point_solver *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  int iVar47;
  int iVar48;
  field3d<cellb> *pfVar49;
  field3d<celle> *pfVar50;
  celle ***pppcVar51;
  celle **ppcVar52;
  celle *pcVar53;
  celle *pcVar54;
  cellb *pcVar55;
  celle *pcVar56;
  celle **ppcVar57;
  celle **ppcVar58;
  celle **ppcVar59;
  cellb **ppcVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  byte bVar68;
  bool bVar69;
  ulong uVar70;
  ulong uVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  long lVar75;
  uint uVar76;
  long lVar77;
  ulong uVar78;
  ulong uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  ulong local_138;
  undefined1 auVar122 [64];
  undefined1 auVar126 [64];
  undefined1 auVar132 [64];
  undefined1 auVar142 [64];
  undefined1 auVar149 [64];
  
  pfVar49 = (this->super_maxwell_solver).cb;
  iVar46 = pfVar49->nx;
  lVar75 = (long)iVar46;
  iVar47 = pfVar49->ny;
  iVar48 = pfVar49->nz;
  uVar76 = iVar46 - 2;
  uVar72 = iVar47 - 2;
  uVar71 = (ulong)uVar76;
  if (3 < lVar75) {
    auVar92 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar84._8_8_ = 0x8000000000000000;
    auVar84._0_8_ = 0x8000000000000000;
    auVar93 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar94 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar95 = vpbroadcastq_avx512f(ZEXT816(8));
    uVar79 = 1;
    auVar96 = vpbroadcastq_avx512f();
    do {
      if (3 < iVar47) {
        auVar80._8_8_ = 0;
        auVar80._0_8_ = (this->super_maxwell_solver).dtdz;
        auVar97 = vbroadcastsd_avx512f(auVar80);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = (this->super_maxwell_solver).dtdx;
        auVar98 = vbroadcastsd_avx512f(auVar81);
        auVar91._8_8_ = 0;
        auVar91._0_8_ = (this->super_maxwell_solver).dtdy;
        auVar99 = vbroadcastsd_avx512f(auVar91);
        auVar89._8_8_ = 0;
        auVar89._0_8_ = this->ay;
        auVar100 = vbroadcastsd_avx512f(auVar89);
        auVar90._8_8_ = 0;
        auVar90._0_8_ = this->by;
        auVar101 = vbroadcastsd_avx512f(auVar90);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = this->az;
        auVar102 = vbroadcastsd_avx512f(auVar9);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = this->bz;
        auVar103 = vbroadcastsd_avx512f(auVar10);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = this->ax;
        in_ZMM16 = vbroadcastsd_avx512f(auVar11);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = this->bx;
        auVar104 = vbroadcastsd_avx512f(auVar12);
        pfVar50 = (this->super_maxwell_solver).ce;
        uVar78 = 1;
        auVar161._0_8_ = auVar98._0_8_ ^ 0x8000000000000000;
        auVar161._8_8_ = auVar98._8_8_ ^ 0x8000000000000000;
        auVar80 = vxorpd_avx512vl(auVar99._0_16_,auVar84);
        auVar160._0_8_ = auVar97._0_8_ ^ 0x8000000000000000;
        auVar160._8_8_ = auVar97._8_8_ ^ 0x8000000000000000;
        auVar105 = vbroadcastsd_avx512f(auVar80);
        auVar106 = vbroadcastsd_avx512f(auVar160);
        auVar107 = vbroadcastsd_avx512f(auVar161);
        do {
          if (3 < iVar48) {
            pppcVar51 = (pfVar50->p)._M_t.
                        super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                        super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                        super__Head_base<0UL,_celle_***,_false>._M_head_impl;
            auVar108 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
            ppcVar52 = pppcVar51[uVar79];
            pcVar53 = ppcVar52[uVar78];
            pcVar54 = ppcVar52[uVar78 + 2];
            auVar13._8_8_ = 0;
            auVar13._0_8_ = pcVar53->ex;
            auVar109 = vbroadcastsd_avx512f(auVar13);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = pcVar53[2].ex;
            auVar110 = vbroadcastsd_avx512f(auVar14);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = pcVar53->ey;
            auVar111 = vbroadcastsd_avx512f(auVar15);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = pcVar53[2].ey;
            auVar112 = vbroadcastsd_avx512f(auVar16);
            auVar113 = vpbroadcastq_avx512f();
            auVar114 = vpbroadcastq_avx512f();
            pcVar55 = (pfVar49->p)._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl[uVar79][uVar78];
            auVar115 = vpbroadcastq_avx512f();
            auVar116 = vpbroadcastq_avx512f();
            auVar117 = vpbroadcastq_avx512f();
            uVar73 = 0;
            do {
              auVar118 = vpbroadcastq_avx512f();
              auVar119 = vpmullq_avx512dq(auVar108,auVar94);
              auVar80 = vxorpd_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
              auVar81 = vxorpd_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
              auVar120 = vmovdqa64_avx512f(auVar93);
              uVar74 = uVar73 + 8;
              auVar108 = vpaddq_avx512f(auVar108,auVar95);
              auVar93 = vporq_avx512f(auVar118,auVar93);
              auVar118 = vmovdqa64_avx512f(auVar96);
              uVar70 = vpcmpuq_avx512f(auVar93,auVar96,2);
              auVar96 = vpaddq_avx512f(auVar113,auVar119);
              auVar121 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&ppcVar52[uVar78 + 1]->ex +
                                             (long)&(pfVar50->p)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>
                                                  .super__Head_base<0UL,_celle_***,_false>));
              bVar68 = (byte)uVar70;
              auVar93._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar121._8_8_;
              auVar93._0_8_ = (ulong)(bVar68 & 1) * auVar121._0_8_;
              auVar93._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar121._16_8_;
              auVar93._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar121._24_8_;
              auVar93._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar121._32_8_;
              auVar93._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar121._40_8_;
              auVar93._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar121._48_8_;
              auVar93._56_8_ = (uVar70 >> 7) * auVar121._56_8_;
              auVar121 = vgatherqpd_avx512f(pcVar54->ez);
              auVar82._0_8_ =
                   (ulong)(bVar68 & 1) * auVar121._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_
              ;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar82._8_8_ = (ulong)bVar69 * auVar121._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
              auVar122._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar121._16_8_;
              auVar122._0_16_ = auVar82;
              auVar122._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar121._24_8_;
              auVar122._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar121._32_8_;
              auVar122._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar121._40_8_;
              auVar122._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar121._48_8_;
              auVar122._56_8_ = (uVar70 >> 7) * auVar121._56_8_;
              auVar123 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&pcVar54->ex +
                                             (long)&(pfVar50->p)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>
                                                  .super__Head_base<0UL,_celle_***,_false>));
              auVar121._0_8_ =
                   (ulong)(bVar68 & 1) * auVar123._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar81._0_8_
              ;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar121._8_8_ = (ulong)bVar69 * auVar123._8_8_ | (ulong)!bVar69 * auVar81._8_8_;
              auVar121._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar123._16_8_;
              auVar121._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar123._24_8_;
              auVar121._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar123._32_8_;
              auVar121._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar123._40_8_;
              auVar121._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar123._48_8_;
              auVar121._56_8_ = (uVar70 >> 7) * auVar123._56_8_;
              auVar124 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&ppcVar52[uVar78 - 1]->ex +
                                             (long)&(pfVar50->p)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>
                                                  .super__Head_base<0UL,_celle_***,_false>));
              auVar123._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar124._8_8_;
              auVar123._0_8_ = (ulong)(bVar68 & 1) * auVar124._0_8_;
              auVar123._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar124._16_8_;
              auVar123._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar124._24_8_;
              auVar123._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar124._32_8_;
              auVar123._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar124._40_8_;
              auVar123._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar124._48_8_;
              auVar123._56_8_ = (uVar70 >> 7) * auVar124._56_8_;
              auVar124 = vgatherqpd_avx512f(pcVar54->ey);
              auVar125._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar124._8_8_;
              auVar125._0_8_ = (ulong)(bVar68 & 1) * auVar124._0_8_;
              auVar125._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar124._16_8_;
              auVar125._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar124._24_8_;
              auVar125._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar124._32_8_;
              auVar125._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar124._40_8_;
              auVar125._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar124._48_8_;
              auVar125._56_8_ = (uVar70 >> 7) * auVar124._56_8_;
              auVar80 = vxorpd_avx512vl(auVar96._0_16_,auVar96._0_16_);
              auVar96 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar53[2].ey + (long)pfVar50));
              auVar124._0_8_ =
                   (ulong)(bVar68 & 1) * auVar96._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar124._8_8_ = (ulong)bVar69 * auVar96._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
              auVar124._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar96._16_8_;
              auVar124._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar96._24_8_;
              auVar124._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar96._32_8_;
              auVar124._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar96._40_8_;
              auVar124._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar96._48_8_;
              auVar124._56_8_ = (uVar70 >> 7) * auVar96._56_8_;
              auVar96 = vsubpd_avx512f(auVar93,auVar122);
              auVar93 = vsubpd_avx512f(auVar121,auVar93);
              auVar111 = vpermt2pd_avx512f(_DAT_00138c00,auVar111);
              auVar93 = vaddpd_avx512f(auVar122,auVar93);
              auVar93 = vsubpd_avx512f(auVar93,auVar123);
              auVar112 = vpermt2pd_avx512f(_DAT_00138c00,auVar112);
              auVar93 = vmulpd_avx512f(auVar100,auVar93);
              auVar121 = vsubpd_avx512f(auVar112,auVar125);
              auVar112 = vsubpd_avx512f(auVar124,auVar112);
              auVar93 = vfmadd231pd_avx512f(auVar93,auVar101,auVar96);
              auVar80 = vxorpd_avx512vl(auVar96._0_16_,auVar96._0_16_);
              auVar96 = vaddpd_avx512f(auVar125,auVar112);
              auVar96 = vsubpd_avx512f(auVar96,auVar111);
              auVar96 = vmulpd_avx512f(auVar102,auVar96);
              auVar96 = vfmadd231pd_avx512f(auVar96,auVar103,auVar121);
              auVar96 = vmulpd_avx512f(auVar96,auVar97);
              auVar96 = vfmadd231pd_avx512f(auVar96,auVar93,auVar105);
              vpaddq_avx512f(auVar117,auVar119);
              auVar93 = vgatherqpd_avx512f(*(undefined8 *)((long)&pfVar50->nx + (long)pcVar55));
              auVar111._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar93._8_8_;
              auVar111._0_8_ = (ulong)(bVar68 & 1) * auVar93._0_8_;
              auVar111._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar93._16_8_;
              auVar111._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar93._24_8_;
              auVar111._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar93._32_8_;
              auVar111._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar93._40_8_;
              auVar111._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar93._48_8_;
              auVar111._56_8_ = (uVar70 >> 7) * auVar93._56_8_;
              auVar96 = vfmadd231pd_avx512f(auVar111,auVar92,auVar96);
              vpaddq_avx512f(auVar116,auVar119);
              vscatterqpd_avx512f(ZEXT864(pcVar55) + auVar101,uVar70,auVar96);
              auVar93 = vgatherqpd_avx512f(*(undefined8 *)(uVar73 + 0x18));
              auVar96._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar93._8_8_;
              auVar96._0_8_ = (ulong)(bVar68 & 1) * auVar93._0_8_;
              auVar96._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar93._16_8_;
              auVar96._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar93._24_8_;
              auVar96._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar93._32_8_;
              auVar96._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar93._40_8_;
              auVar96._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar93._48_8_;
              auVar96._56_8_ = (uVar70 >> 7) * auVar93._56_8_;
              auVar93 = vgatherqpd_avx512f(pppcVar51[uVar79 + 2][uVar78]->ez);
              auVar112._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar93._8_8_;
              auVar112._0_8_ = (ulong)(bVar68 & 1) * auVar93._0_8_;
              auVar112._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar93._16_8_;
              auVar112._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar93._24_8_;
              auVar112._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar93._32_8_;
              auVar112._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar93._40_8_;
              auVar112._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar93._48_8_;
              auVar112._56_8_ = (uVar70 >> 7) * auVar93._56_8_;
              auVar93 = vsubpd_avx512f(auVar96,auVar122);
              auVar96 = vsubpd_avx512f(auVar112,auVar96);
              vpaddq_avx512f(auVar114,auVar119);
              auVar111 = vgatherqpd_avx512f(_DAT_00000010);
              auVar83._0_8_ =
                   (ulong)(bVar68 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_
              ;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar83._8_8_ = (ulong)bVar69 * auVar111._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
              auVar126._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar111._16_8_;
              auVar126._0_16_ = auVar83;
              auVar126._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar111._24_8_;
              auVar126._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar111._32_8_;
              auVar126._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar111._40_8_;
              auVar126._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar111._48_8_;
              auVar126._56_8_ = (uVar70 >> 7) * auVar111._56_8_;
              auVar96 = vaddpd_avx512f(auVar122,auVar96);
              auVar80 = vxorpd_avx512vl(auVar82,auVar82);
              auVar96 = vsubpd_avx512f(auVar96,auVar126);
              auVar81 = vxorpd_avx512vl(auVar83,auVar83);
              auVar111 = vgatherqpd_avx512f(*(undefined8 *)((long)&pfVar50->nx + (long)&pcVar53->ex)
                                           );
              in_ZMM30._0_8_ =
                   (ulong)(bVar68 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar81._0_8_
              ;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              in_ZMM30._8_8_ = (ulong)bVar69 * auVar111._8_8_ | (ulong)!bVar69 * auVar81._8_8_;
              in_ZMM30._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar111._16_8_;
              in_ZMM30._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar111._24_8_;
              in_ZMM30._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar111._32_8_;
              in_ZMM30._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar111._40_8_;
              in_ZMM30._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar111._48_8_;
              in_ZMM30._56_8_ = (uVar70 >> 7) * auVar111._56_8_;
              auVar111 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&pfVar50->nx + (long)&pcVar53[2].ex));
              in_ZMM29._0_8_ =
                   (ulong)(bVar68 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_
              ;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              in_ZMM29._8_8_ = (ulong)bVar69 * auVar111._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
              in_ZMM29._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar111._16_8_;
              in_ZMM29._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar111._24_8_;
              in_ZMM29._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar111._32_8_;
              in_ZMM29._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar111._40_8_;
              in_ZMM29._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar111._48_8_;
              in_ZMM29._56_8_ = (uVar70 >> 7) * auVar111._56_8_;
              auVar96 = vmulpd_avx512f(in_ZMM16,auVar96);
              auVar96 = vfmadd231pd_avx512f(auVar96,auVar104,auVar93);
              auVar93 = vpermt2pd_avx512f(_DAT_00138c00,auVar109);
              auVar111 = vpermt2pd_avx512f(_DAT_00138c00,auVar110);
              auVar110 = vsubpd_avx512f(in_ZMM29,auVar111);
              auVar111 = vsubpd_avx512f(auVar111,in_ZMM30);
              auVar110 = vaddpd_avx512f(in_ZMM30,auVar110);
              auVar93 = vsubpd_avx512f(auVar110,auVar93);
              auVar110 = vpaddq_avx512f(auVar115,auVar119);
              auVar93 = vmulpd_avx512f(auVar102,auVar93);
              auVar93 = vfmadd231pd_avx512f(auVar93,auVar103,auVar111);
              auVar93 = vmulpd_avx512f(auVar93,auVar106);
              auVar80 = vxorpd_avx512vl(auVar111._0_16_,auVar111._0_16_);
              auVar111 = vgatherqpd_avx512f(pppcVar51[uVar79 - 1][uVar78]->ey);
              auVar109._0_8_ =
                   (ulong)(bVar68 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_
              ;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar109._8_8_ = (ulong)bVar69 * auVar111._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
              auVar109._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar111._16_8_;
              auVar109._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar111._24_8_;
              auVar109._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar111._32_8_;
              auVar109._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar111._40_8_;
              auVar109._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar111._48_8_;
              auVar109._56_8_ = (uVar70 >> 7) * auVar111._56_8_;
              auVar96 = vfmadd231pd_avx512f(auVar93,auVar96,auVar98);
              auVar93 = vfmadd231pd_avx512f(auVar109,auVar92,auVar96);
              auVar80 = vxorpd_avx512vl(auVar96._0_16_,auVar96._0_16_);
              vscatterqpd_avx512f(ZEXT864(8) + auVar110,uVar70,auVar93);
              auVar81 = vxorpd_avx512vl(auVar93._0_16_,auVar93._0_16_);
              auVar96 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pfVar50->nx + (long)ppcVar52[uVar78 + 1]));
              auVar119._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar96._8_8_;
              auVar119._0_8_ = (ulong)(bVar68 & 1) * auVar96._0_8_;
              auVar119._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar96._16_8_;
              auVar119._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar96._24_8_;
              auVar119._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar96._32_8_;
              auVar119._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar96._40_8_;
              auVar119._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar96._48_8_;
              auVar119._56_8_ = (uVar70 >> 7) * auVar96._56_8_;
              auVar96 = vgatherqpd_avx512f(*(undefined8 *)((long)&pfVar50->nx + (long)pcVar54));
              auVar127._0_8_ =
                   (ulong)(bVar68 & 1) * auVar96._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar127._8_8_ = (ulong)bVar69 * auVar96._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
              auVar127._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar96._16_8_;
              auVar127._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar96._24_8_;
              auVar127._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar96._32_8_;
              auVar127._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar96._40_8_;
              auVar127._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar96._48_8_;
              auVar127._56_8_ = (uVar70 >> 7) * auVar96._56_8_;
              auVar96 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pfVar50->nx + (long)ppcVar52[uVar78 - 1]));
              auVar128._0_8_ =
                   (ulong)(bVar68 & 1) * auVar96._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar81._0_8_;
              bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar128._8_8_ = (ulong)bVar69 * auVar96._8_8_ | (ulong)!bVar69 * auVar81._8_8_;
              auVar128._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar96._16_8_;
              auVar128._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar96._24_8_;
              auVar128._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar96._32_8_;
              auVar128._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar96._40_8_;
              auVar128._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar96._48_8_;
              auVar128._56_8_ = (uVar70 >> 7) * auVar96._56_8_;
              auVar96 = vsubpd_avx512f(auVar127,auVar119);
              auVar93 = vsubpd_avx512f(auVar119,in_ZMM30);
              auVar96 = vaddpd_avx512f(in_ZMM30,auVar96);
              auVar96 = vsubpd_avx512f(auVar96,auVar128);
              auVar96 = vmulpd_avx512f(auVar100,auVar96);
              in_ZMM26 = vfmadd231pd_avx512f(auVar96,auVar101,auVar93);
              auVar96 = vgatherqpd_avx512f(*(undefined8 *)(uVar73 + 0x10));
              auVar129._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar96._8_8_;
              auVar129._0_8_ = (ulong)(bVar68 & 1) * auVar96._0_8_;
              auVar129._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar96._16_8_;
              auVar129._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar96._24_8_;
              auVar129._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar96._32_8_;
              auVar129._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar96._40_8_;
              auVar129._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar96._48_8_;
              auVar129._56_8_ = (uVar70 >> 7) * auVar96._56_8_;
              auVar96 = vgatherqpd_avx512f(pppcVar51[uVar79 + 2][uVar78]->ey);
              auVar130._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar96._8_8_;
              auVar130._0_8_ = (ulong)(bVar68 & 1) * auVar96._0_8_;
              auVar130._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar96._16_8_;
              auVar130._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar96._24_8_;
              auVar130._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar96._32_8_;
              auVar130._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar96._40_8_;
              auVar130._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar96._48_8_;
              auVar130._56_8_ = (uVar70 >> 7) * auVar96._56_8_;
              auVar96 = vgatherqpd_avx512f(_DAT_00000008);
              auVar131._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar96._8_8_;
              auVar131._0_8_ = (ulong)(bVar68 & 1) * auVar96._0_8_;
              auVar131._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar96._16_8_;
              auVar131._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar96._24_8_;
              auVar131._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar96._32_8_;
              auVar131._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar96._40_8_;
              auVar131._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar96._48_8_;
              auVar131._56_8_ = (uVar70 >> 7) * auVar96._56_8_;
              auVar96 = vsubpd_avx512f(auVar130,auVar129);
              auVar96 = vaddpd_avx512f(auVar125,auVar96);
              auVar111 = vsubpd_avx512f(auVar96,auVar131);
              auVar112 = vsubpd_avx512f(auVar129,auVar125);
              auVar96 = vmovdqa64_avx512f(auVar118);
              auVar93 = vmovdqa64_avx512f(auVar120);
              auVar111 = vmulpd_avx512f(in_ZMM16,auVar111);
              auVar111 = vfmadd231pd_avx512f(auVar111,auVar104,auVar112);
              auVar112 = vgatherqpd_avx512f(pppcVar51[uVar79 - 1][uVar78]->ez);
              auVar118._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar112._8_8_;
              auVar118._0_8_ = (ulong)(bVar68 & 1) * auVar112._0_8_;
              auVar118._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar112._16_8_;
              auVar118._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar112._24_8_;
              auVar118._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar112._32_8_;
              auVar118._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar112._40_8_;
              auVar118._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar112._48_8_;
              auVar118._56_8_ = (uVar70 >> 7) * auVar112._56_8_;
              auVar111 = vmulpd_avx512f(auVar111,auVar107);
              auVar111 = vfmadd231pd_avx512f(auVar111,auVar99,in_ZMM26);
              auVar111 = vfmadd231pd_avx512f(auVar118,auVar92,auVar111);
              vscatterqpd_avx512f(ZEXT864(0x10) + auVar110,uVar70,auVar111);
              uVar73 = uVar74;
              auVar111 = auVar125;
              auVar110 = in_ZMM29;
              auVar112 = auVar124;
              auVar109 = in_ZMM30;
            } while (((ulong)(iVar48 - 2) + 6 & 0x1fffffff8) != uVar74);
          }
          uVar78 = uVar78 + 1;
        } while (uVar78 != uVar72);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != uVar71);
  }
  if (3 < iVar47) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar92 = vbroadcastsd_avx512f(auVar17);
    auVar162._8_8_ = 0x8000000000000000;
    auVar162._0_8_ = 0x8000000000000000;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar94 = vbroadcastsd_avx512f(auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar95 = vbroadcastsd_avx512f(auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = this->ay;
    auVar96 = vbroadcastsd_avx512f(auVar20);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = this->by;
    auVar93 = vbroadcastsd_avx512f(auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = this->az;
    auVar97 = vbroadcastsd_avx512f(auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = this->bz;
    auVar98 = vbroadcastsd_avx512f(auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = this->ax;
    auVar99 = vbroadcastsd_avx512f(auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = this->bx;
    auVar100 = vbroadcastsd_avx512f(auVar25);
    auVar101 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar102 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar103 = vpbroadcastq_avx512f(ZEXT816(0x18));
    uVar79 = 1;
    auVar170._0_8_ = auVar92._0_8_ ^ 0x8000000000000000;
    auVar170._8_8_ = auVar92._8_8_ ^ 0x8000000000000000;
    auVar172._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
    auVar172._8_8_ = auVar94._8_8_ ^ 0x8000000000000000;
    auVar84 = vxorpd_avx512vl(auVar95._0_16_,auVar162);
    auVar111 = vpbroadcastq_avx512f();
    auVar104 = vbroadcastsd_avx512f(auVar170);
    auVar105 = vbroadcastsd_avx512f(auVar172);
    auVar106 = vbroadcastsd_avx512f(auVar84);
    auVar107 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (3 < iVar48) {
        auVar113 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
        uVar78 = 0;
        ppcVar52 = (((this->super_maxwell_solver).ce)->p)._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar75 + -1];
        pcVar53 = ppcVar52[uVar79];
        pcVar54 = ppcVar52[uVar79 - 1];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = pcVar53->ex;
        auVar112 = vbroadcastsd_avx512f(auVar26);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pcVar53[2].ex;
        auVar110 = vbroadcastsd_avx512f(auVar27);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = pcVar53->ey;
        auVar108 = vbroadcastsd_avx512f(auVar28);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = pcVar53[2].ey;
        auVar109 = vbroadcastsd_avx512f(auVar29);
        auVar114 = vpbroadcastq_avx512f();
        auVar115 = vpbroadcastq_avx512f();
        pcVar55 = (pfVar49->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar75 + -1][uVar79];
        auVar116 = vpbroadcastq_avx512f();
        do {
          auVar117 = vpbroadcastq_avx512f();
          auVar118 = vpmullq_avx512dq(auVar113,auVar103);
          auVar84 = vxorpd_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
          auVar119 = vmovdqa64_avx512f(auVar111);
          uVar78 = uVar78 + 8;
          auVar113 = vpaddq_avx512f(auVar113,auVar107);
          auVar117 = vporq_avx512f(auVar117,auVar102);
          uVar73 = vpcmpuq_avx512f(auVar117,auVar111,2);
          auVar80 = vpxord_avx512vl(auVar117._0_16_,auVar117._0_16_);
          auVar111 = vpaddq_avx512f(auVar114,auVar118);
          auVar120 = vgatherqpd_avx512f(*(undefined8 *)
                                         ((long)&ppcVar52[uVar79 + 1]->ez + (long)pcVar54));
          bVar68 = (byte)uVar73;
          auVar85._0_8_ =
               (ulong)(bVar68 & 1) * auVar120._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar85._8_8_ = (ulong)bVar69 * auVar120._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
          auVar117._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar120._16_8_;
          auVar117._0_16_ = auVar85;
          auVar117._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar120._24_8_;
          auVar117._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar120._32_8_;
          auVar117._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar120._40_8_;
          auVar117._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar120._48_8_;
          auVar117._56_8_ = (uVar73 >> 7) * auVar120._56_8_;
          auVar120 = vgatherqpd_avx512f(*(undefined8 *)(uVar79 + 0x10));
          auVar86._0_8_ =
               (ulong)(bVar68 & 1) * auVar120._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar86._8_8_ = (ulong)bVar69 * auVar120._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar132._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar120._16_8_;
          auVar132._0_16_ = auVar86;
          auVar132._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar120._24_8_;
          auVar132._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar120._32_8_;
          auVar132._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar120._40_8_;
          auVar132._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar120._48_8_;
          auVar132._56_8_ = (uVar73 >> 7) * auVar120._56_8_;
          auVar120 = vgatherqpd_avx512f(*(undefined8 *)
                                         ((long)&ppcVar52[uVar79 + 2]->ez + (long)pcVar54));
          auVar133._8_8_ = (ulong)((byte)(uVar73 >> 1) & 1) * auVar120._8_8_;
          auVar133._0_8_ = (ulong)(bVar68 & 1) * auVar120._0_8_;
          auVar133._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar120._16_8_;
          auVar133._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar120._24_8_;
          auVar133._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar120._32_8_;
          auVar133._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar120._40_8_;
          auVar133._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar120._48_8_;
          auVar133._56_8_ = (uVar73 >> 7) * auVar120._56_8_;
          auVar120 = vsubpd_avx512f(auVar117,auVar132);
          auVar117 = vsubpd_avx512f(auVar133,auVar117);
          auVar84 = vxorpd_avx512vl(auVar85,auVar85);
          auVar121 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar54 * 2 + 0x10));
          auVar134._0_8_ =
               (ulong)(bVar68 & 1) * auVar121._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar134._8_8_ = (ulong)bVar69 * auVar121._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar134._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar121._16_8_;
          auVar134._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar121._24_8_;
          auVar134._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar121._32_8_;
          auVar134._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar121._40_8_;
          auVar134._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar121._48_8_;
          auVar134._56_8_ = (uVar73 >> 7) * auVar121._56_8_;
          auVar121 = vgatherqpd_avx512f(*(undefined8 *)(uVar79 + 8));
          auVar135._8_8_ = (ulong)((byte)(uVar73 >> 1) & 1) * auVar121._8_8_;
          auVar135._0_8_ = (ulong)(bVar68 & 1) * auVar121._0_8_;
          auVar135._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar121._16_8_;
          auVar135._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar121._24_8_;
          auVar135._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar121._32_8_;
          auVar135._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar121._40_8_;
          auVar135._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar121._48_8_;
          auVar135._56_8_ = (uVar73 >> 7) * auVar121._56_8_;
          auVar84 = vxorpd_avx512vl(auVar111._0_16_,auVar111._0_16_);
          auVar111 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar54->ex + (long)&pcVar53[2].ey));
          auVar136._0_8_ =
               (ulong)(bVar68 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar136._8_8_ = (ulong)bVar69 * auVar111._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar136._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar111._16_8_;
          auVar136._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar111._24_8_;
          auVar136._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar111._32_8_;
          auVar136._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar111._40_8_;
          auVar136._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar111._48_8_;
          auVar136._56_8_ = (uVar73 >> 7) * auVar111._56_8_;
          auVar111 = vaddpd_avx512f(auVar132,auVar117);
          auVar111 = vsubpd_avx512f(auVar111,auVar134);
          auVar108 = vpermt2pd_avx512f(_DAT_00138c00,auVar108);
          auVar109 = vpermt2pd_avx512f(_DAT_00138c00,auVar109);
          auVar111 = vmulpd_avx512f(auVar96,auVar111);
          auVar111 = vfmadd231pd_avx512f(auVar111,auVar93,auVar120);
          auVar117 = vsubpd_avx512f(auVar136,auVar109);
          auVar109 = vsubpd_avx512f(auVar109,auVar135);
          auVar117 = vaddpd_avx512f(auVar135,auVar117);
          auVar108 = vsubpd_avx512f(auVar117,auVar108);
          auVar84 = vxorpd_avx512vl(auVar117._0_16_,auVar117._0_16_);
          auVar117 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar54->ex + (long)&pcVar55->bx));
          auVar120._0_8_ =
               (ulong)(bVar68 & 1) * auVar117._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar120._8_8_ = (ulong)bVar69 * auVar117._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar120._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar117._16_8_;
          auVar120._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar117._24_8_;
          auVar120._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar117._32_8_;
          auVar120._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar117._40_8_;
          auVar120._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar117._48_8_;
          auVar120._56_8_ = (uVar73 >> 7) * auVar117._56_8_;
          auVar108 = vmulpd_avx512f(auVar97,auVar108);
          auVar108 = vfmadd231pd_avx512f(auVar108,auVar98,auVar109);
          auVar108 = vmulpd_avx512f(auVar108,auVar94);
          auVar84 = vxorpd_avx512vl(auVar109._0_16_,auVar109._0_16_);
          auVar111 = vfmadd231pd_avx512f(auVar108,auVar104,auVar111);
          vpaddq_avx512f(auVar115,auVar118);
          auVar109 = vfmadd231pd_avx512f(auVar120,auVar101,auVar111);
          auVar80 = vxorpd_avx512vl(auVar111._0_16_,auVar111._0_16_);
          vscatterqpd_avx512f(ZEXT864(pcVar55) + ZEXT864(0) + auVar100,uVar73,auVar109);
          auVar81 = vxorpd_avx512vl(auVar109._0_16_,auVar109._0_16_);
          auVar111 = vgatherqpd_avx512f(pcVar55->bz);
          auVar108._0_8_ =
               (ulong)(bVar68 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar108._8_8_ = (ulong)bVar69 * auVar111._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
          auVar108._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar111._16_8_;
          auVar108._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar111._24_8_;
          auVar108._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar111._32_8_;
          auVar108._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar111._40_8_;
          auVar108._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar111._48_8_;
          auVar108._56_8_ = (uVar73 >> 7) * auVar111._56_8_;
          auVar111 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar54->ex + (long)&pcVar53->ex));
          auVar137._0_8_ =
               (ulong)(bVar68 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar81._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar137._8_8_ = (ulong)bVar69 * auVar111._8_8_ | (ulong)!bVar69 * auVar81._8_8_;
          auVar137._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar111._16_8_;
          auVar137._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar111._24_8_;
          auVar137._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar111._32_8_;
          auVar137._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar111._40_8_;
          auVar137._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar111._48_8_;
          auVar137._56_8_ = (uVar73 >> 7) * auVar111._56_8_;
          auVar111 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar54->ex + (long)&pcVar53[2].ex));
          auVar138._0_8_ =
               (ulong)(bVar68 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar138._8_8_ = (ulong)bVar69 * auVar111._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar138._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar111._16_8_;
          auVar138._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar111._24_8_;
          auVar138._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar111._32_8_;
          auVar138._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar111._40_8_;
          auVar138._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar111._48_8_;
          auVar138._56_8_ = (uVar73 >> 7) * auVar111._56_8_;
          auVar111 = vsubpd_avx512f(auVar132,auVar108);
          auVar112 = vpermt2pd_avx512f(_DAT_00138c00,auVar112);
          auVar110 = vpermt2pd_avx512f(_DAT_00138c00,auVar110);
          auVar111 = vmulpd_avx512f(auVar99,auVar111);
          auVar109 = vfnmadd231pd_avx512f(auVar111,auVar100,auVar132);
          auVar84 = vxorpd_avx512vl(auVar86,auVar86);
          auVar111 = vsubpd_avx512f(auVar138,auVar110);
          auVar110 = vsubpd_avx512f(auVar110,auVar137);
          auVar111 = vaddpd_avx512f(auVar137,auVar111);
          auVar112 = vsubpd_avx512f(auVar111,auVar112);
          auVar111 = vmovdqa64_avx512f(auVar119);
          auVar112 = vmulpd_avx512f(auVar97,auVar112);
          auVar110 = vfmadd231pd_avx512f(auVar112,auVar98,auVar110);
          vpaddq_avx512f(auVar116,auVar118);
          auVar110 = vmulpd_avx512f(auVar110,auVar105);
          auVar110 = vfmadd231pd_avx512f(auVar110,auVar95,auVar109);
          auVar80 = vxorpd_avx512vl(auVar109._0_16_,auVar109._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)(int)uVar76 + 8));
          auVar139._0_8_ =
               (ulong)(bVar68 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar139._8_8_ = (ulong)bVar69 * auVar112._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
          auVar139._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar112._16_8_;
          auVar139._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar112._24_8_;
          auVar139._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar112._32_8_;
          auVar139._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar112._40_8_;
          auVar139._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar112._48_8_;
          auVar139._56_8_ = (uVar73 >> 7) * auVar112._56_8_;
          auVar112 = vfmadd231pd_avx512f(auVar139,auVar101,auVar110);
          auVar80 = vxorpd_avx512vl(auVar110._0_16_,auVar110._0_16_);
          vscatterqpd_avx512f(ZEXT864(8) + auVar104,uVar73,auVar112);
          auVar81 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar110 = vgatherqpd_avx512f(*(undefined8 *)
                                         ((long)&pcVar54->ex + (long)&ppcVar52[uVar79 + 1]->ex));
          auVar140._0_8_ =
               (ulong)(bVar68 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar81._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar140._8_8_ = (ulong)bVar69 * auVar110._8_8_ | (ulong)!bVar69 * auVar81._8_8_;
          auVar140._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar110._16_8_;
          auVar140._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar110._24_8_;
          auVar140._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar110._32_8_;
          auVar140._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar110._40_8_;
          auVar140._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar110._48_8_;
          auVar140._56_8_ = (uVar73 >> 7) * auVar110._56_8_;
          auVar110 = vgatherqpd_avx512f(*(undefined8 *)
                                         ((long)&pcVar54->ex + (long)&ppcVar52[uVar79 + 2]->ex));
          auVar141._0_8_ =
               (ulong)(bVar68 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar141._8_8_ = (ulong)bVar69 * auVar110._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
          auVar141._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar110._16_8_;
          auVar141._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar110._24_8_;
          auVar141._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar110._32_8_;
          auVar141._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar110._40_8_;
          auVar141._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar110._48_8_;
          auVar141._56_8_ = (uVar73 >> 7) * auVar110._56_8_;
          auVar110 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar54 * 2));
          in_ZMM30._0_8_ =
               (ulong)(bVar68 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          in_ZMM30._8_8_ = (ulong)bVar69 * auVar110._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          in_ZMM30._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar110._16_8_;
          in_ZMM30._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar110._24_8_;
          in_ZMM30._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar110._32_8_;
          in_ZMM30._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar110._40_8_;
          in_ZMM30._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar110._48_8_;
          in_ZMM30._56_8_ = (uVar73 >> 7) * auVar110._56_8_;
          auVar110 = vsubpd_avx512f(auVar141,auVar140);
          auVar112 = vsubpd_avx512f(auVar140,auVar137);
          auVar110 = vaddpd_avx512f(auVar137,auVar110);
          auVar110 = vsubpd_avx512f(auVar110,in_ZMM30);
          auVar110 = vmulpd_avx512f(auVar96,auVar110);
          auVar110 = vfmadd231pd_avx512f(auVar110,auVar93,auVar112);
          auVar84 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar112 = vgatherqpd_avx512f(pcVar55->by);
          auVar87._0_8_ =
               (ulong)(bVar68 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar87._8_8_ = (ulong)bVar69 * auVar112._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar142._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar112._16_8_;
          auVar142._0_16_ = auVar87;
          auVar142._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar112._24_8_;
          auVar142._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar112._32_8_;
          auVar142._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar112._40_8_;
          auVar142._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar112._48_8_;
          auVar142._56_8_ = (uVar73 >> 7) * auVar112._56_8_;
          auVar112 = vsubpd_avx512f(auVar135,auVar142);
          auVar84 = vxorpd_avx512vl(auVar87,auVar87);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)(int)uVar76 + 0x10));
          auVar143._0_8_ =
               (ulong)(bVar68 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar143._8_8_ = (ulong)bVar69 * auVar109._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar143._16_8_ = (ulong)((byte)(uVar73 >> 2) & 1) * auVar109._16_8_;
          auVar143._24_8_ = (ulong)((byte)(uVar73 >> 3) & 1) * auVar109._24_8_;
          auVar143._32_8_ = (ulong)((byte)(uVar73 >> 4) & 1) * auVar109._32_8_;
          auVar143._40_8_ = (ulong)((byte)(uVar73 >> 5) & 1) * auVar109._40_8_;
          auVar143._48_8_ = (ulong)((byte)(uVar73 >> 6) & 1) * auVar109._48_8_;
          auVar143._56_8_ = (uVar73 >> 7) * auVar109._56_8_;
          auVar112 = vmulpd_avx512f(auVar99,auVar112);
          auVar112 = vfnmadd231pd_avx512f(auVar112,auVar100,auVar135);
          auVar112 = vmulpd_avx512f(auVar112,auVar106);
          auVar110 = vfmadd231pd_avx512f(auVar112,auVar92,auVar110);
          auVar110 = vfmadd231pd_avx512f(auVar143,auVar101,auVar110);
          vscatterqpd_avx512f(ZEXT864(0x10) + auVar104,uVar73,auVar110);
          auVar110 = auVar138;
          auVar112 = auVar137;
          auVar109 = auVar136;
          auVar108 = auVar135;
        } while (((ulong)(iVar48 - 2) + 6 & 0x1fffffff8) != uVar78);
      }
      uVar79 = uVar79 + 1;
      in_ZMM16 = _DAT_00138c00;
    } while (uVar79 != uVar72);
  }
  if (3 < iVar46) {
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar92 = vbroadcastsd_avx512f(auVar30);
    auVar158._8_8_ = 0x8000000000000000;
    auVar158._0_8_ = 0x8000000000000000;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar94 = vbroadcastsd_avx512f(auVar31);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar95 = vbroadcastsd_avx512f(auVar32);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = this->ay;
    auVar96 = vbroadcastsd_avx512f(auVar33);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = this->by;
    auVar93 = vbroadcastsd_avx512f(auVar34);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = this->az;
    auVar97 = vbroadcastsd_avx512f(auVar35);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = this->bz;
    auVar98 = vbroadcastsd_avx512f(auVar36);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = this->ax;
    auVar99 = vbroadcastsd_avx512f(auVar37);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = this->bx;
    auVar100 = vbroadcastsd_avx512f(auVar38);
    auVar101 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar102 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar103 = vpbroadcastq_avx512f(ZEXT816(8));
    pfVar50 = (this->super_maxwell_solver).ce;
    lVar75 = (long)(int)uVar72;
    uVar79 = 1;
    uVar78 = (ulong)(iVar48 - 2) + 6 & 0x1fffffff8;
    auVar104 = vpbroadcastq_avx512f();
    auVar178._0_8_ = auVar92._0_8_ ^ 0x8000000000000000;
    auVar178._8_8_ = auVar92._8_8_ ^ 0x8000000000000000;
    auVar157._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
    auVar157._8_8_ = auVar94._8_8_ ^ 0x8000000000000000;
    auVar84 = vxorpd_avx512vl(auVar95._0_16_,auVar158);
    auVar105 = vbroadcastsd_avx512f(auVar178);
    auVar106 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar107 = vbroadcastsd_avx512f(auVar157);
    auVar111 = vbroadcastsd_avx512f(auVar84);
    do {
      if (3 < iVar48) {
        pppcVar51 = (pfVar50->p)._M_t.
                    super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                    super__Head_base<0UL,_celle_***,_false>._M_head_impl;
        auVar115 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
        ppcVar52 = pppcVar51[uVar79];
        pcVar53 = ppcVar52[(long)iVar47 + -1];
        pcVar54 = pppcVar51[uVar79 - 1][(long)iVar47 + -1];
        pcVar56 = ppcVar52[lVar75];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = pcVar53->ex;
        auVar113 = vbroadcastsd_avx512f(auVar39);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = pcVar53[2].ex;
        auVar109 = vbroadcastsd_avx512f(auVar40);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = pcVar53->ey;
        auVar114 = vbroadcastsd_avx512f(auVar41);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = pcVar53[2].ey;
        auVar108 = vbroadcastsd_avx512f(auVar42);
        pcVar55 = (pfVar49->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl[uVar79][(long)iVar47 + -1];
        auVar110 = vpbroadcastq_avx512f();
        auVar116 = vpbroadcastq_avx512f();
        auVar117 = vpbroadcastq_avx512f();
        auVar118 = vpbroadcastq_avx512f();
        auVar110 = vmovdqu64_avx512f(auVar110);
        auVar112 = vpbroadcastq_avx512f();
        auVar112 = vmovdqu64_avx512f(auVar112);
        uVar73 = 0;
        do {
          auVar119 = vpmullq_avx512dq(auVar115,auVar102);
          auVar120 = vpaddq_avx512f(auVar119,auVar110);
          auVar121 = vpbroadcastq_avx512f();
          auVar84 = vxorpd_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          uVar74 = uVar73 + 8;
          auVar115 = vpaddq_avx512f(auVar115,auVar103);
          auVar121 = vporq_avx512f(auVar121,auVar106);
          uVar70 = vpcmpuq_avx512f(auVar121,auVar104,2);
          auVar80 = vpxord_avx512vl(auVar121._0_16_,auVar121._0_16_);
          vpaddq_avx512f(auVar118,auVar119);
          auVar121 = vgatherqpd_avx512f((pfVar50->p)._M_t.
                                        super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>
                                        .super__Head_base<0UL,_celle_***,_false>._M_head_impl);
          bVar68 = (byte)uVar70;
          auVar144._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar121._8_8_;
          auVar144._0_8_ = (ulong)(bVar68 & 1) * auVar121._0_8_;
          auVar144._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar121._16_8_;
          auVar144._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar121._24_8_;
          auVar144._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar121._32_8_;
          auVar144._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar121._40_8_;
          auVar144._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar121._48_8_;
          auVar144._56_8_ = (uVar70 >> 7) * auVar121._56_8_;
          auVar121 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar56->ez + uVar78));
          auVar145._0_8_ =
               (ulong)(bVar68 & 1) * auVar121._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar145._8_8_ = (ulong)bVar69 * auVar121._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
          auVar145._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar121._16_8_;
          auVar145._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar121._24_8_;
          auVar145._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar121._32_8_;
          auVar145._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar121._40_8_;
          auVar145._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar121._48_8_;
          auVar145._56_8_ = (uVar70 >> 7) * auVar121._56_8_;
          auVar121 = vgatherqpd_avx512f(*(undefined8 *)&pfVar50->nz);
          in_ZMM16._0_8_ =
               (ulong)(bVar68 & 1) * auVar121._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          in_ZMM16._8_8_ = (ulong)bVar69 * auVar121._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          in_ZMM16._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar121._16_8_;
          in_ZMM16._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar121._24_8_;
          in_ZMM16._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar121._32_8_;
          in_ZMM16._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar121._40_8_;
          in_ZMM16._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar121._48_8_;
          in_ZMM16._56_8_ = (uVar70 >> 7) * auVar121._56_8_;
          auVar84 = vxorpd_avx512vl(auVar120._0_16_,auVar120._0_16_);
          auVar120 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar53[2].ey + uVar78));
          auVar146._0_8_ =
               (ulong)(bVar68 & 1) * auVar120._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar146._8_8_ = (ulong)bVar69 * auVar120._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar146._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar120._16_8_;
          auVar146._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar120._24_8_;
          auVar146._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar120._32_8_;
          auVar146._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar120._40_8_;
          auVar146._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar120._48_8_;
          auVar146._56_8_ = (uVar70 >> 7) * auVar120._56_8_;
          auVar120 = vsubpd_avx512f(auVar144,auVar145);
          auVar120 = vmulpd_avx512f(auVar96,auVar120);
          auVar114 = vpermt2pd_avx512f(_DAT_00138c00,auVar114);
          auVar108 = vpermt2pd_avx512f(_DAT_00138c00,auVar108);
          auVar120 = vfnmadd231pd_avx512f(auVar120,auVar93,auVar144);
          auVar121 = vsubpd_avx512f(auVar146,auVar108);
          auVar108 = vsubpd_avx512f(auVar108,in_ZMM16);
          auVar121 = vaddpd_avx512f(in_ZMM16,auVar121);
          auVar114 = vsubpd_avx512f(auVar121,auVar114);
          auVar114 = vmulpd_avx512f(auVar97,auVar114);
          auVar114 = vfmadd231pd_avx512f(auVar114,auVar98,auVar108);
          auVar84 = vxorpd_avx512vl(auVar108._0_16_,auVar108._0_16_);
          auVar108 = vmulpd_avx512f(auVar95,auVar114);
          auVar108 = vfmadd231pd_avx512f(auVar108,auVar107,auVar120);
          auVar114 = vpaddq_avx512f(auVar117,auVar119);
          auVar120 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar55->bx + uVar78));
          auVar147._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar120._8_8_;
          auVar147._0_8_ = (ulong)(bVar68 & 1) * auVar120._0_8_;
          auVar147._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar120._16_8_;
          auVar147._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar120._24_8_;
          auVar147._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar120._32_8_;
          auVar147._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar120._40_8_;
          auVar147._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar120._48_8_;
          auVar147._56_8_ = (uVar70 >> 7) * auVar120._56_8_;
          auVar120 = vfmadd231pd_avx512f(auVar147,auVar101,auVar108);
          auVar80 = vxorpd_avx512vl(auVar108._0_16_,auVar108._0_16_);
          vscatterqpd_avx512f(ZEXT864(pcVar55) + auVar144,uVar70,auVar120);
          vpaddq_avx512f(auVar116,auVar119);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)(uVar73 + 0x18));
          auVar148._0_8_ =
               (ulong)(bVar68 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar148._8_8_ = (ulong)bVar69 * auVar108._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
          auVar148._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar108._16_8_;
          auVar148._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar108._24_8_;
          auVar148._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar108._32_8_;
          auVar148._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar108._40_8_;
          auVar148._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar108._48_8_;
          auVar148._56_8_ = (uVar70 >> 7) * auVar108._56_8_;
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)(lVar75 + 0x10));
          auVar88._0_8_ =
               (ulong)(bVar68 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar88._8_8_ = (ulong)bVar69 * auVar108._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar149._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar108._16_8_;
          auVar149._0_16_ = auVar88;
          auVar149._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar108._24_8_;
          auVar149._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar108._32_8_;
          auVar149._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar108._40_8_;
          auVar149._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar108._48_8_;
          auVar149._56_8_ = (uVar70 >> 7) * auVar108._56_8_;
          auVar108 = vsubpd_avx512f(auVar148,auVar144);
          auVar120 = vsubpd_avx512f(auVar149,auVar148);
          auVar84 = vxorpd_avx512vl(auVar88,auVar88);
          auVar121 = vaddpd_avx512f(auVar144,auVar120);
          auVar80 = vxorpd_avx512vl(auVar120._0_16_,auVar120._0_16_);
          auVar120 = vgatherqpd_avx512f(pcVar54->ez);
          auVar150._0_8_ =
               (ulong)(bVar68 & 1) * auVar120._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar80._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar150._8_8_ = (ulong)bVar69 * auVar120._8_8_ | (ulong)!bVar69 * auVar80._8_8_;
          auVar150._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar120._16_8_;
          auVar150._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar120._24_8_;
          auVar150._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar120._32_8_;
          auVar150._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar120._40_8_;
          auVar150._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar120._48_8_;
          auVar150._56_8_ = (uVar70 >> 7) * auVar120._56_8_;
          auVar120 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar53->ex + uVar78));
          auVar151._0_8_ =
               (ulong)(bVar68 & 1) * auVar120._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar151._8_8_ = (ulong)bVar69 * auVar120._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar151._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar120._16_8_;
          auVar151._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar120._24_8_;
          auVar151._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar120._32_8_;
          auVar151._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar120._40_8_;
          auVar151._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar120._48_8_;
          auVar151._56_8_ = (uVar70 >> 7) * auVar120._56_8_;
          auVar120 = vsubpd_avx512f(auVar121,auVar150);
          auVar113 = vpermt2pd_avx512f(_DAT_00138c00,auVar113);
          auVar120 = vmulpd_avx512f(auVar99,auVar120);
          auVar120 = vfmadd231pd_avx512f(auVar120,auVar100,auVar108);
          auVar84 = vxorpd_avx512vl(auVar108._0_16_,auVar108._0_16_);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar53[2].ex + uVar78));
          auVar152._0_8_ =
               (ulong)(bVar68 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar152._8_8_ = (ulong)bVar69 * auVar108._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar152._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar108._16_8_;
          auVar152._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar108._24_8_;
          auVar152._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar108._32_8_;
          auVar152._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar108._40_8_;
          auVar152._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar108._48_8_;
          auVar152._56_8_ = (uVar70 >> 7) * auVar108._56_8_;
          auVar109 = vpermt2pd_avx512f(_DAT_00138c00,auVar109);
          auVar108 = vsubpd_avx512f(auVar152,auVar109);
          auVar108 = vaddpd_avx512f(auVar151,auVar108);
          auVar108 = vsubpd_avx512f(auVar108,auVar113);
          auVar109 = vsubpd_avx512f(auVar109,auVar151);
          auVar108 = vmulpd_avx512f(auVar97,auVar108);
          auVar109 = vfmadd231pd_avx512f(auVar108,auVar98,auVar109);
          auVar109 = vmulpd_avx512f(auVar109,auVar111);
          vpaddq_avx512f(auVar119,auVar112);
          auVar109 = vfmadd231pd_avx512f(auVar109,auVar120,auVar92);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)(uVar79 + 8));
          auVar113._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar108._8_8_;
          auVar113._0_8_ = (ulong)(bVar68 & 1) * auVar108._0_8_;
          auVar113._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar108._16_8_;
          auVar113._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar108._24_8_;
          auVar113._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar108._32_8_;
          auVar113._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar108._40_8_;
          auVar113._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar108._48_8_;
          auVar113._56_8_ = (uVar70 >> 7) * auVar108._56_8_;
          auVar109 = vfmadd231pd_avx512f(auVar113,auVar101,auVar109);
          vscatterqpd_avx512f(ZEXT864(8) + auVar100,uVar70,auVar109);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar56->ex + uVar78));
          auVar153._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar109._8_8_;
          auVar153._0_8_ = (ulong)(bVar68 & 1) * auVar109._0_8_;
          auVar153._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar109._16_8_;
          auVar153._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar109._24_8_;
          auVar153._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar109._32_8_;
          auVar153._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar109._40_8_;
          auVar153._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar109._48_8_;
          auVar153._56_8_ = (uVar70 >> 7) * auVar109._56_8_;
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)(uVar73 + 0x10));
          auVar154._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar109._8_8_;
          auVar154._0_8_ = (ulong)(bVar68 & 1) * auVar109._0_8_;
          auVar154._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar109._16_8_;
          auVar154._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar109._24_8_;
          auVar154._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar109._32_8_;
          auVar154._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar109._40_8_;
          auVar154._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar109._48_8_;
          auVar154._56_8_ = (uVar70 >> 7) * auVar109._56_8_;
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)(lVar75 + 8));
          auVar155._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar109._8_8_;
          auVar155._0_8_ = (ulong)(bVar68 & 1) * auVar109._0_8_;
          auVar155._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar109._16_8_;
          auVar155._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar109._24_8_;
          auVar155._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar109._32_8_;
          auVar155._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar109._40_8_;
          auVar155._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar109._48_8_;
          auVar155._56_8_ = (uVar70 >> 7) * auVar109._56_8_;
          auVar84 = vxorpd_avx512vl(auVar114._0_16_,auVar114._0_16_);
          auVar109 = vgatherqpd_avx512f(pcVar54->ey);
          auVar114._0_8_ =
               (ulong)(bVar68 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar68 & 1) * auVar84._0_8_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar114._8_8_ = (ulong)bVar69 * auVar109._8_8_ | (ulong)!bVar69 * auVar84._8_8_;
          auVar114._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar109._16_8_;
          auVar114._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar109._24_8_;
          auVar114._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar109._32_8_;
          auVar114._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar109._40_8_;
          auVar114._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar109._48_8_;
          auVar114._56_8_ = (uVar70 >> 7) * auVar109._56_8_;
          auVar109 = vsubpd_avx512f(auVar151,auVar153);
          auVar108 = vsubpd_avx512f(auVar155,auVar154);
          auVar113 = vsubpd_avx512f(auVar154,in_ZMM16);
          auVar109 = vmulpd_avx512f(auVar96,auVar109);
          auVar108 = vaddpd_avx512f(in_ZMM16,auVar108);
          auVar109 = vfnmadd231pd_avx512f(auVar109,auVar93,auVar151);
          auVar108 = vsubpd_avx512f(auVar108,auVar114);
          auVar108 = vmulpd_avx512f(auVar99,auVar108);
          auVar108 = vfmadd231pd_avx512f(auVar108,auVar100,auVar113);
          auVar108 = vmulpd_avx512f(auVar108,auVar105);
          auVar109 = vfmadd231pd_avx512f(auVar108,auVar94,auVar109);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)(uVar79 + 0x10));
          auVar156._8_8_ = (ulong)((byte)(uVar70 >> 1) & 1) * auVar108._8_8_;
          auVar156._0_8_ = (ulong)(bVar68 & 1) * auVar108._0_8_;
          auVar156._16_8_ = (ulong)((byte)(uVar70 >> 2) & 1) * auVar108._16_8_;
          auVar156._24_8_ = (ulong)((byte)(uVar70 >> 3) & 1) * auVar108._24_8_;
          auVar156._32_8_ = (ulong)((byte)(uVar70 >> 4) & 1) * auVar108._32_8_;
          auVar156._40_8_ = (ulong)((byte)(uVar70 >> 5) & 1) * auVar108._40_8_;
          auVar156._48_8_ = (ulong)((byte)(uVar70 >> 6) & 1) * auVar108._48_8_;
          auVar156._56_8_ = (uVar70 >> 7) * auVar108._56_8_;
          auVar109 = vfmadd231pd_avx512f(auVar156,auVar101,auVar109);
          vscatterqpd_avx512f(ZEXT864(0x10) + auVar100,uVar70,auVar109);
          uVar73 = uVar74;
          auVar109 = auVar152;
          auVar108 = auVar146;
          auVar113 = auVar151;
          auVar114 = in_ZMM16;
        } while (uVar78 != uVar74);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != uVar71);
    if (3 < iVar46) {
      dVar1 = (this->super_maxwell_solver).dtdy;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = dVar1;
      dVar2 = (this->super_maxwell_solver).dtdz;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = dVar2;
      dVar3 = (this->super_maxwell_solver).dtdx;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = dVar3;
      pfVar50 = (this->super_maxwell_solver).ce;
      auVar7._0_8_ = this->bx;
      auVar7._8_8_ = this->by;
      auVar8._0_8_ = this->ax;
      auVar8._8_8_ = this->ay;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = this->by;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = this->ay;
      auVar171._8_8_ = 0x3fe0000000000000;
      auVar171._0_8_ = 0x3fe0000000000000;
      lVar75 = ((long)iVar48 + -1) * 0x18;
      auVar163._0_8_ = -dVar1;
      auVar163._8_8_ = 0x8000000000000000;
      auVar165._0_8_ = -dVar2;
      auVar165._8_8_ = 0x8000000000000000;
      auVar84 = vunpcklpd_avx(auVar167,auVar163);
      auVar80 = vunpcklpd_avx(auVar165,auVar164);
      auVar166._8_8_ = this->bz;
      auVar166._0_8_ = this->bz;
      dVar1 = this->az;
      local_138 = 1;
      do {
        if (3 < iVar47) {
          lVar77 = 0;
          pppcVar51 = (pfVar50->p)._M_t.
                      super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                      super__Head_base<0UL,_celle_***,_false>._M_head_impl;
          ppcVar52 = pppcVar51[local_138 - 1];
          ppcVar57 = pppcVar51[local_138];
          ppcVar58 = pppcVar51[local_138 + 1];
          ppcVar59 = pppcVar51[local_138 + 2];
          ppcVar60 = (pfVar49->p)._M_t.
                     super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                     super__Head_base<0UL,_cellb_***,_false>._M_head_impl[local_138];
          do {
            lVar61 = *(long *)((long)ppcVar58 + lVar77 + 8);
            lVar62 = *(long *)((long)ppcVar59 + lVar77 + 8);
            lVar63 = *(long *)((long)ppcVar57 + lVar77 + 8);
            lVar64 = *(long *)((long)ppcVar57 + lVar77 + 0x10);
            lVar65 = *(long *)((long)ppcVar57 + lVar77 + 0x18);
            lVar66 = *(long *)((long)ppcVar57 + lVar77);
            lVar67 = *(long *)((long)ppcVar60 + lVar77 + 8);
            auVar81 = *(undefined1 (*) [16])(lVar63 + lVar75);
            uVar4 = *(undefined8 *)(lVar63 + 0x10 + lVar75);
            auVar173._8_8_ = uVar4;
            auVar173._0_8_ = uVar4;
            dVar2 = *(double *)(lVar63 + 8 + lVar75);
            auVar183._8_8_ = 0;
            auVar183._0_8_ = dVar2;
            uVar4 = *(undefined8 *)(lVar64 + 0x10 + lVar75);
            auVar184._8_8_ = uVar4;
            auVar184._0_8_ = uVar4;
            uVar4 = *(undefined8 *)(lVar65 + 0x10 + lVar75);
            auVar186._8_8_ = uVar4;
            auVar186._0_8_ = uVar4;
            auVar91 = vsubpd_avx(auVar81,*(undefined1 (*) [16])
                                          (lVar63 + -0x30 + (long)iVar48 * 0x18));
            lVar63 = *(long *)((long)ppcVar52 + lVar77 + 8);
            lVar77 = lVar77 + 8;
            auVar89 = vsubpd_avx512vl(auVar186,auVar184);
            auVar90 = vsubpd_avx512vl(auVar184,auVar173);
            auVar179._0_8_ = auVar91._0_8_ * dVar1;
            auVar179._8_8_ = auVar91._8_8_ * dVar1;
            auVar89 = vaddpd_avx512vl(auVar173,auVar89);
            uVar4 = *(undefined8 *)(lVar66 + 0x10 + lVar75);
            auVar187._8_8_ = uVar4;
            auVar187._0_8_ = uVar4;
            auVar91 = vfnmadd231pd_fma(auVar179,auVar166,auVar81);
            auVar180._0_8_ = auVar91._0_8_ * auVar80._0_8_;
            auVar180._8_8_ = auVar91._8_8_ * auVar80._8_8_;
            auVar91 = vsubpd_avx512vl(auVar89,auVar187);
            auVar174._0_8_ = auVar91._0_8_ * (double)auVar8._0_8_;
            auVar174._8_8_ = auVar91._8_8_ * (double)auVar8._8_8_;
            auVar91 = vfmadd231pd_avx512vl(auVar174,auVar7,auVar90);
            auVar89 = vfmadd231pd_fma(auVar180,auVar84,auVar91);
            auVar91 = vpermilpd_avx(*(undefined1 (*) [16])(lVar67 + lVar75),1);
            auVar91 = vfmadd231pd_fma(auVar91,auVar89,auVar171);
            auVar91 = vshufpd_avx(auVar91,auVar91,1);
            *(undefined1 (*) [16])(lVar67 + lVar75) = auVar91;
            dVar5 = *(double *)(lVar61 + 8 + lVar75);
            auVar181._8_8_ = 0;
            auVar181._0_8_ = dVar5;
            dVar6 = *(double *)(lVar64 + lVar75);
            auVar175._8_8_ = 0;
            auVar175._0_8_ = dVar6;
            auVar185._8_8_ = 0;
            auVar185._0_8_ = *(ulong *)(lVar62 + 8 + lVar75);
            auVar91 = vsubsd_avx512f(auVar185,auVar181);
            auVar188._8_8_ = 0;
            auVar188._0_8_ = *(ulong *)(lVar65 + lVar75);
            auVar89 = vsubsd_avx512f(auVar188,auVar175);
            auVar91 = vaddsd_avx512f(auVar183,auVar91);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = *(ulong *)(lVar63 + 8 + lVar75);
            auVar91 = vsubsd_avx512f(auVar91,auVar43);
            auVar89 = vaddsd_avx512f(auVar81,auVar89);
            auVar44._8_8_ = 0;
            auVar44._0_8_ = *(ulong *)(lVar66 + lVar75);
            auVar89 = vsubsd_avx512f(auVar89,auVar44);
            auVar91 = vmulsd_avx512f(auVar8,auVar91);
            auVar89 = vmulsd_avx512f(auVar169,auVar89);
            auVar182._8_8_ = 0;
            auVar182._0_8_ = dVar5 - dVar2;
            auVar91 = vfmadd231sd_fma(auVar91,auVar7,auVar182);
            auVar176._8_8_ = 0;
            auVar176._0_8_ = dVar6 - auVar81._0_8_;
            auVar81 = vfmadd231sd_fma(auVar89,auVar168,auVar176);
            auVar177._8_8_ = 0;
            auVar177._0_8_ = auVar91._0_8_ * -dVar3;
            auVar81 = vfmadd231sd_fma(auVar177,auVar159,auVar81);
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *(ulong *)(lVar67 + 0x10 + lVar75);
            auVar81 = vfmadd213sd_fma(auVar81,ZEXT816(0x3fe0000000000000),auVar45);
            *(long *)(lVar67 + 0x10 + lVar75) = auVar81._0_8_;
          } while ((ulong)uVar72 * 8 + -8 != lVar77);
        }
        local_138 = local_138 + 1;
      } while (local_138 != uVar71);
    }
  }
  return;
}

Assistant:

void five_point_solver::advance_b()
{
    const int nx = cb.get_nx();
    const int ny = cb.get_ny();
    const int nz = cb.get_nz();
    // 1/2 b advance
    for(int i=1;i<nx-2;i++) {
        for(int j=1;j<ny-2;j++) {
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    {int i=nx-1;
        for(int j=1;j<ny-2;j++) {
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(-ce[i][j][k].ez) + ax*(ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(-ce[i][j][k].ey) + ax*(ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    for(int i=1;i<nx-2;i++) {
        {int j=ny-1;
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(-ce[i][j][k].ez) + ay*(ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(-ce[i][j][k].ex) + ay*(ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    for(int i=1;i<nx-2;i++) {
        for(int j=1;j<ny-2;j++) {
            {int k=nz-1;
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(-ce[i][j][k].ey) + az*(ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(-ce[i][j][k].ex) + az*(ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
}